

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O2

void __thiscall
QSharedMemoryPrivate::setUnixErrorString(QSharedMemoryPrivate *this,QLatin1StringView function)

{
  int iVar1;
  long lVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  SharedMemoryError SVar6;
  int *piVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  QLatin1StringView function_local;
  
  function_local.m_data = function.m_data;
  function_local.m_size = function.m_size;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar7 = __errno_location();
  iVar1 = *piVar7;
  if (iVar1 == 2) {
    QSharedMemory::tr((QString *)&local_60,"%1: doesn\'t exist",(char *)0x0,-1);
    QString::arg<QLatin1String,_true>
              ((QString *)&local_48,(QString *)&local_60,&function_local,0,(QChar)0x20);
    pDVar4 = (this->errorString).d.d;
    pcVar5 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_48.d;
    (this->errorString).d.ptr = local_48.ptr;
    qVar3 = (this->errorString).d.size;
    (this->errorString).d.size = local_48.size;
    local_48.d = pDVar4;
    local_48.ptr = pcVar5;
    local_48.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    SVar6 = NotFound;
    goto LAB_00208d93;
  }
  if ((iVar1 != 0xc) && (iVar1 != 0x1c)) {
    if (iVar1 == 0x11) {
      QSharedMemory::tr((QString *)&local_60,"%1: already exists",(char *)0x0,-1);
      QString::arg<QLatin1String,_true>
                ((QString *)&local_48,(QString *)&local_60,&function_local,0,(QChar)0x20);
      pDVar4 = (this->errorString).d.d;
      pcVar5 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_48.d;
      (this->errorString).d.ptr = local_48.ptr;
      qVar3 = (this->errorString).d.size;
      (this->errorString).d.size = local_48.size;
      local_48.d = pDVar4;
      local_48.ptr = pcVar5;
      local_48.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      SVar6 = AlreadyExists;
      goto LAB_00208d93;
    }
    if (iVar1 != 0x18) {
      if (iVar1 == 0xd) {
        QSharedMemory::tr((QString *)&local_60,"%1: permission denied",(char *)0x0,-1);
        QString::arg<QLatin1String,_true>
                  ((QString *)&local_48,(QString *)&local_60,&function_local,0,(QChar)0x20);
        pDVar4 = (this->errorString).d.d;
        pcVar5 = (this->errorString).d.ptr;
        (this->errorString).d.d = local_48.d;
        (this->errorString).d.ptr = local_48.ptr;
        qVar3 = (this->errorString).d.size;
        (this->errorString).d.size = local_48.size;
        local_48.d = pDVar4;
        local_48.ptr = pcVar5;
        local_48.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        SVar6 = PermissionDenied;
      }
      else {
        QSharedMemory::tr((QString *)&local_60,"%1: unknown error: %2",(char *)0x0,-1);
        qt_error_string((QString *)&QStack_78,*piVar7);
        QString::arg<QLatin1String&,QString>
                  ((type *)&local_48,(QString *)&local_60,&function_local,(QString *)&QStack_78);
        pDVar4 = (this->errorString).d.d;
        pcVar5 = (this->errorString).d.ptr;
        (this->errorString).d.d = local_48.d;
        (this->errorString).d.ptr = local_48.ptr;
        qVar3 = (this->errorString).d.size;
        (this->errorString).d.size = local_48.size;
        local_48.d = pDVar4;
        local_48.ptr = pcVar5;
        local_48.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        SVar6 = UnknownError;
      }
      goto LAB_00208d93;
    }
  }
  QSharedMemory::tr((QString *)&local_60,"%1: out of resources",(char *)0x0,-1);
  QString::arg<QLatin1String,_true>
            ((QString *)&local_48,(QString *)&local_60,&function_local,0,(QChar)0x20);
  pDVar4 = (this->errorString).d.d;
  pcVar5 = (this->errorString).d.ptr;
  (this->errorString).d.d = local_48.d;
  (this->errorString).d.ptr = local_48.ptr;
  qVar3 = (this->errorString).d.size;
  (this->errorString).d.size = local_48.size;
  local_48.d = pDVar4;
  local_48.ptr = pcVar5;
  local_48.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  SVar6 = OutOfResources;
LAB_00208d93:
  this->error = SVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSharedMemoryPrivate::setUnixErrorString(QLatin1StringView function)
{
    // EINVAL is handled in functions so they can give better error strings
    switch (errno) {
    case EACCES:
        errorString = QSharedMemory::tr("%1: permission denied").arg(function);
        error = QSharedMemory::PermissionDenied;
        break;
    case EEXIST:
        errorString = QSharedMemory::tr("%1: already exists").arg(function);
        error = QSharedMemory::AlreadyExists;
        break;
    case ENOENT:
        errorString = QSharedMemory::tr("%1: doesn't exist").arg(function);
        error = QSharedMemory::NotFound;
        break;
    case EMFILE:
    case ENOMEM:
    case ENOSPC:
        errorString = QSharedMemory::tr("%1: out of resources").arg(function);
        error = QSharedMemory::OutOfResources;
        break;
    default:
        errorString = QSharedMemory::tr("%1: unknown error: %2")
                .arg(function, qt_error_string(errno));
        error = QSharedMemory::UnknownError;
#if defined QSHAREDMEMORY_DEBUG
        qDebug() << errorString << "key" << key << "errno" << errno << EINVAL;
#endif
    }
}